

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

void forbody(LexState *ls,int base,int line,int nvars,int isnum)

{
  FuncState *fs_00;
  int local_54;
  int local_48;
  int local_44;
  int endfor;
  int prep;
  FuncState *fs;
  BlockCnt bl;
  int isnum_local;
  int nvars_local;
  int line_local;
  int base_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  bl.breaklist = isnum;
  bl._12_4_ = nvars;
  adjustlocalvars(ls,3);
  checknext(ls,0x103);
  if (bl.breaklist == 0) {
    local_44 = luaK_jump(fs_00);
  }
  else {
    local_44 = luaK_codeABx(fs_00,OP_FORPREP,base,0x1fffe);
  }
  enterblock(fs_00,(BlockCnt *)&fs,'\0');
  adjustlocalvars(ls,bl._12_4_);
  luaK_reserveregs(fs_00,bl._12_4_);
  block(ls);
  leaveblock(fs_00);
  luaK_patchtohere(fs_00,local_44);
  if (bl.breaklist == 0) {
    local_48 = luaK_codeABC(fs_00,OP_TFORLOOP,base,0,bl._12_4_);
  }
  else {
    local_48 = luaK_codeABx(fs_00,OP_FORLOOP,base,0x1fffe);
  }
  luaK_fixline(fs_00,line);
  if (bl.breaklist == 0) {
    local_54 = luaK_jump(fs_00);
  }
  else {
    local_54 = local_48;
  }
  luaK_patchlist(fs_00,local_54,local_44 + 1);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isnum) {
  /* forbody -> DO block */
  BlockCnt bl;
  FuncState *fs = ls->fs;
  int prep, endfor;
  adjustlocalvars(ls, 3);  /* control variables */
  checknext(ls, TK_DO);
  prep = isnum ? luaK_codeAsBx(fs, OP_FORPREP, base, NO_JUMP) : luaK_jump(fs);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  luaK_patchtohere(fs, prep);
  endfor = (isnum) ? luaK_codeAsBx(fs, OP_FORLOOP, base, NO_JUMP) :
                     luaK_codeABC(fs, OP_TFORLOOP, base, 0, nvars);
  luaK_fixline(fs, line);  /* pretend that `OP_FOR' starts the loop */
  luaK_patchlist(fs, (isnum ? endfor : luaK_jump(fs)), prep + 1);
}